

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

wrapper<std::shared_ptr<ILogger>,_boost::ext::di::v1_2_0::wrappers::shared<boost::ext::di::v1_2_0::scopes::singleton,_ConsoleLogger,_std::shared_ptr<ConsoleLogger>_&>_>
 __thiscall
boost::ext::di::v1_2_0::core::
injector<boost::ext::di::v1_2_0::config,boost::ext::di::v1_2_0::core::pool<boost::ext::di::v1_2_0::aux::type_list<>>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>
::
create_successful_impl__<boost::ext::di::v1_2_0::aux::integral_constant<bool,false>,std::shared_ptr<ILogger>,boost::ext::di::v1_2_0::no_name>
          (injector<boost::ext::di::v1_2_0::config,boost::ext::di::v1_2_0::core::pool<boost::ext::di::v1_2_0::aux::type_list<>>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>
           *this)

{
  shared<boost::ext::di::v1_2_0::scopes::singleton,_ConsoleLogger,_std::shared_ptr<ConsoleLogger>_&>
  sVar1;
  provider<boost::ext::di::v1_2_0::aux::pair<ConsoleLogger,_boost::ext::di::v1_2_0::aux::pair<boost::ext::di::v1_2_0::type_traits::uniform,_boost::ext::di::v1_2_0::aux::type_list<>_>_>,_boost::ext::di::v1_2_0::core::injector<boost::ext::di::v1_2_0::config,_boost::ext::di::v1_2_0::core::pool<boost::ext::di::v1_2_0::aux::type_list<>_>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>_>
  local_8;
  
  local_8.injector_ =
       (injector<boost::ext::di::v1_2_0::config,_boost::ext::di::v1_2_0::core::pool<boost::ext::di::v1_2_0::aux::type_list<>_>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>
        *)this;
  sVar1 = scopes::deduce::scope<ILogger,ConsoleLogger>::
          create<std::shared_ptr<ILogger>,boost::ext::di::v1_2_0::no_name,boost::ext::di::v1_2_0::core::successful::provider<boost::ext::di::v1_2_0::aux::pair<ConsoleLogger,boost::ext::di::v1_2_0::aux::pair<boost::ext::di::v1_2_0::type_traits::uniform,boost::ext::di::v1_2_0::aux::type_list<>>>,boost::ext::di::v1_2_0::core::injector<boost::ext::di::v1_2_0::config,boost::ext::di::v1_2_0::core::pool<boost::ext::di::v1_2_0::aux::type_list<>>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>>>
                    ((scope<ILogger,ConsoleLogger> *)this,&local_8);
  return (wrapper<std::shared_ptr<ILogger>,_boost::ext::di::v1_2_0::wrappers::shared<boost::ext::di::v1_2_0::scopes::singleton,_ConsoleLogger,_std::shared_ptr<ConsoleLogger>_&>_>
          )sVar1.object;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }